

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O2

void * __thiscall
Diligent::DynamicLinearAllocator::Allocate(DynamicLinearAllocator *this,size_t size,size_t align)

{
  pointer pBVar1;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  undefined4 extraout_var;
  pointer pBVar5;
  string msg;
  ulong local_38;
  
  if (size == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pBVar1 = (this->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar5 = (this->m_Blocks).
                  super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar5 != pBVar1; pBVar5 = pBVar5 + 1)
    {
      pvVar4 = (void *)AlignUp<unsigned_long,unsigned_long>((unsigned_long)pBVar5->CurrPtr,align);
      if ((uint8_t *)((long)pvVar4 + size) <= pBVar5->Data + pBVar5->Size) {
        pBVar5->CurrPtr = (uint8_t *)((long)pvVar4 + size);
        return pvVar4;
      }
    }
    uVar2 = (ulong)this->m_BlockSize;
    do {
      local_38 = uVar2;
      uVar2 = local_38 * 2;
    } while (local_38 < (size + align) - 1);
    iVar3 = (**this->m_pAllocator->_vptr_IMemoryAllocator)
                      (this->m_pAllocator,local_38,"dynamic linear allocator page",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                       ,0x6a);
    msg._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
    std::
    vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
    ::emplace_back<void*,unsigned_long&>
              ((vector<Diligent::DynamicLinearAllocator::Block,std::allocator<Diligent::DynamicLinearAllocator::Block>>
                *)this,(void **)&msg,&local_38);
    pBVar5 = (this->m_Blocks).
             super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar4 = (void *)AlignUp<unsigned_long,unsigned_long>((unsigned_long)pBVar5[-1].Data,align);
    if (pBVar5[-1].Data + pBVar5[-1].Size < (uint8_t *)(size + (long)pvVar4)) {
      FormatString<char[50]>
                (&msg,(char (*) [50])"Not enough space in the new block - this is a bug");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/DynamicLinearAllocator.hpp"
                 ,0x6e);
      std::__cxx11::string::~string((string *)&msg);
    }
    pBVar5[-1].CurrPtr = (uint8_t *)(size + (long)pvVar4);
  }
  return pvVar4;
}

Assistant:

NODISCARD void* Allocate(size_t size, size_t align)
    {
        if (size == 0)
            return nullptr;

        for (auto& block : m_Blocks)
        {
            auto* Ptr = AlignUp(block.CurrPtr, align);
            if (Ptr + size <= block.Data + block.Size)
            {
                block.CurrPtr = Ptr + size;
                return Ptr;
            }
        }

        // Create a new block
        size_t BlockSize = m_BlockSize;
        while (BlockSize < size + align - 1)
            BlockSize *= 2;
        m_Blocks.emplace_back(m_pAllocator->Allocate(BlockSize, "dynamic linear allocator page", __FILE__, __LINE__), BlockSize);

        auto& block = m_Blocks.back();
        auto* Ptr   = AlignUp(block.Data, align);
        VERIFY(Ptr + size <= block.Data + block.Size, "Not enough space in the new block - this is a bug");
        block.CurrPtr = Ptr + size;
        return Ptr;
    }